

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O3

void InitGLRMapinfoData(void)

{
  FOptionalMapinfoData *pFVar1;
  level_info_t *plVar2;
  Node *pNVar3;
  SBYTE SVar4;
  uint uVar5;
  SBYTE SVar6;
  Node *pNVar7;
  SBYTE SVar8;
  byte bVar9;
  
  plVar2 = level.info;
  uVar5 = FName::NameManager::FindName(&FName::NameData,"gl_renderer",false);
  pNVar3 = (plVar2->optdata).Nodes + ((plVar2->optdata).Size - 1 & uVar5);
  do {
    pNVar7 = pNVar3;
    if ((pNVar7 == (Node *)0x0) || (pNVar7->Next == (Node *)0x1)) goto LAB_00370bfd;
    pNVar3 = pNVar7->Next;
  } while ((pNVar7->Pair).Key.Index != uVar5);
  pFVar1 = (pNVar7->Pair).Value.Ptr;
  if (pFVar1 == (FOptionalMapinfoData *)0x0) {
LAB_00370bfd:
    gl_SetFogParams(0,(PalEntry)(level.info)->outsidefog,0,0);
    glset.map_lightmode = -1;
    glset.map_nocoloredspritelighting = -1;
    glset.map_notexturefill = -1;
    glset.map_brightfog = -1;
    glset.skyrotatevector2.Y = 0.0;
    glset.skyrotatevector2.Z = 1.0;
    glset.skyrotatevector.X = 0.0;
    glset.skyrotatevector.Y = 0.0;
    glset.skyrotatevector.Z = 1.0;
    glset.skyrotatevector2.X = 0.0;
    glset.pixelstretch = 1.2;
    SVar8 = -1;
    SVar6 = -1;
    SVar4 = -1;
    glset.lightmode = (byte)gl_lightmode.Value;
  }
  else {
    gl_SetFogParams(*(int *)&pFVar1->field_0x14,(PalEntry)(level.info)->outsidefog,
                    *(int *)&pFVar1[1]._vptr_FOptionalMapinfoData,
                    *(int *)((long)&pFVar1[1]._vptr_FOptionalMapinfoData + 4));
    glset.map_lightmode = *(SBYTE *)&pFVar1[1].Next;
    SVar4 = *(SBYTE *)((long)&pFVar1[1].Next + 4);
    SVar8 = (SBYTE)pFVar1[1].identifier.Index;
    glset.map_nocoloredspritelighting = SVar8;
    SVar6 = *(SBYTE *)((long)&pFVar1[1].identifier.Index + 1);
    glset.map_notexturefill = SVar6;
    glset.map_brightfog = SVar4;
    glset.skyrotatevector2._4_8_ = *(undefined8 *)((long)&pFVar1[2].Next + 4);
    glset.skyrotatevector._0_8_ = *(undefined8 *)&pFVar1[1].field_0x14;
    glset._16_8_ = *(undefined8 *)((long)&pFVar1[2]._vptr_FOptionalMapinfoData + 4);
    glset.pixelstretch = *(float *)&pFVar1[2].field_0x14;
    glset.lightmode = glset.map_lightmode;
    if ((4 < (byte)glset.map_lightmode) &&
       (glset.lightmode = (byte)gl_lightmode.Value, glset.map_lightmode == 8)) {
      glset.lightmode = glset.map_lightmode;
    }
  }
  bVar9 = SVar8 != '\0';
  if (SVar8 == -1) {
    bVar9 = gl_nocoloredspritelighting.Value;
  }
  glset.nocoloredspritelighting = (bool)(bVar9 & 1);
  bVar9 = SVar6 != '\0';
  if (SVar6 == -1) {
    bVar9 = gl_notexturefill.Value;
  }
  glset.notexturefill = (bool)(bVar9 & 1);
  bVar9 = SVar4 != '\0';
  if (SVar4 == -1) {
    bVar9 = gl_brightfog.Value;
  }
  glset.brightfog = (bool)(bVar9 & 1);
  return;
}

Assistant:

void InitGLRMapinfoData()
{
	FGLROptions *opt = level.info->GetOptData<FGLROptions>("gl_renderer", false);

	if (opt != NULL)
	{
		gl_SetFogParams(opt->fogdensity, level.info->outsidefog, opt->outsidefogdensity, opt->skyfog);
		glset.map_lightmode = opt->lightmode;
		glset.map_brightfog = opt->brightfog;
		glset.map_nocoloredspritelighting = opt->nocoloredspritelighting;
		glset.map_notexturefill = opt->notexturefill;
		glset.skyrotatevector = opt->skyrotatevector;
		glset.skyrotatevector2 = opt->skyrotatevector2;
		glset.pixelstretch = opt->pixelstretch;
	}
	else
	{
		gl_SetFogParams(0, level.info->outsidefog, 0, 0);
		glset.map_lightmode = -1;
		glset.map_brightfog = -1;
		glset.map_nocoloredspritelighting = -1;
		glset.map_notexturefill = -1;
		glset.skyrotatevector = FVector3(0,0,1);
		glset.skyrotatevector2 = FVector3(0,0,1);
		glset.pixelstretch = 1.2f;
	}

	if (!IsLightmodeValid()) glset.lightmode = gl_lightmode;
	else glset.lightmode = glset.map_lightmode;
	if (glset.map_nocoloredspritelighting == -1) glset.nocoloredspritelighting = gl_nocoloredspritelighting;
	else glset.nocoloredspritelighting = !!glset.map_nocoloredspritelighting;
	if (glset.map_notexturefill == -1) glset.notexturefill = gl_notexturefill;
	else glset.notexturefill = !!glset.map_notexturefill;
	if (glset.map_brightfog == -1) glset.brightfog = gl_brightfog;
	else glset.brightfog = !!glset.map_brightfog;
}